

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O0

void UI::gather_meshops_arg(int *argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  undefined1 local_128 [8];
  string in_msh_1;
  string local_100;
  string local_e0;
  string local_c0;
  allocator<char> local_99;
  string local_98 [8];
  string out_geo;
  string local_70 [8];
  string in_msh;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string arg_check;
  char **argv_local;
  int *argc_local;
  
  arg_check.field_2._8_8_ = argv;
  if (*argc < 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"Error: Incorrect argument count.",&local_179);
    print_ln(&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
  }
  else {
    pcVar1 = argv[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_38,pcVar1,&local_39);
    std::allocator<char>::~allocator(&local_39);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"-s");
    if (bVar2) {
      if (*argc < 5) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"Error: Incorrect argument count.",
                   (allocator<char> *)(in_msh_1.field_2._M_local_buf + 0xf));
        print_ln(&local_100);
        std::__cxx11::string::~string((string *)&local_100);
        std::allocator<char>::~allocator((allocator<char> *)(in_msh_1.field_2._M_local_buf + 0xf));
      }
      else {
        pcVar1 = *(char **)(arg_check.field_2._8_8_ + 0x18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_70,pcVar1,(allocator<char> *)(out_geo.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator((allocator<char> *)(out_geo.field_2._M_local_buf + 0xf));
        pcVar1 = *(char **)(arg_check.field_2._8_8_ + 0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_98,pcVar1,&local_99);
        std::allocator<char>::~allocator(&local_99);
        std::__cxx11::string::string((string *)&local_c0,local_70);
        std::__cxx11::string::string((string *)&local_e0,local_98);
        execute_silver_linings(&local_c0,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string(local_98);
        std::__cxx11::string::~string(local_70);
      }
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"-v");
      if (bVar2) {
        pcVar1 = *(char **)(arg_check.field_2._8_8_ + 0x18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_128,pcVar1,&local_129);
        std::allocator<char>::~allocator(&local_129);
        execute_volume_calculator((string *)local_128);
        std::__cxx11::string::~string((string *)local_128);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_150,"Error: Unrecognized meshops argument.",&local_151);
        print_ln(&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::allocator<char>::~allocator(&local_151);
      }
    }
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void UI::gather_meshops_arg(int &argc, char *argv[])
{
    if (argc > 3)
    {
        std::string arg_check = argv[2];
        if (arg_check=="-s")
        {
            if (argc>4)
            {
                std::string in_msh = argv[3], out_geo = argv[4];
                execute_silver_linings(in_msh,  out_geo);
            }
            else
            {
                print_ln("Error: Incorrect argument count.");
            }
        }
        else if(arg_check=="-v")
        {
            std::string in_msh = argv[3];
            execute_volume_calculator(in_msh);
        }
        else
        {
            print_ln("Error: Unrecognized meshops argument.");
        }
    }
    else
    {
        print_ln("Error: Incorrect argument count.");
    }
}